

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::~CheckerVisitor(CheckerVisitor *this)

{
  bool bVar1;
  iterator this_00;
  reference ppEVar2;
  FunctionInfo *in_RDI;
  ExternalValueExpr *ev;
  iterator __end1_1;
  iterator __begin1_1;
  vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
  *__range1_1;
  pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*> *p;
  iterator __end1;
  iterator __begin1;
  unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
  *__range1;
  unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<SQCompilation::ExternalValueExpr_**,_std::vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>_>
  local_38;
  pointer *local_30;
  reference local_28;
  _Node_iterator_base<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_false>
  local_20;
  _Node_iterator_base<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_false>
  local_18;
  pointer *local_10;
  
  in_RDI->owner = (FunctionDecl *)&PTR__CheckerVisitor_0021cc60;
  local_10 = &in_RDI[1].modifiable.
              super__Vector_base<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    local_28 = std::__detail::
               _Node_iterator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_false,_false>
               ::operator*((_Node_iterator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_false,_false>
                            *)0x1875a7);
    if (local_28->second != (FunctionInfo *)0x0) {
      FunctionInfo::~FunctionInfo(in_RDI);
    }
    std::__detail::
    _Node_iterator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_false,_false>
                  *)in_RDI);
  }
  local_30 = &in_RDI[4].parameters.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_38._M_current =
       (ExternalValueExpr **)
       std::
       vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
       ::begin((vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
                *)in_stack_ffffffffffffffa8);
  this_00 = std::
            vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
            ::end((vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
                   *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<SQCompilation::ExternalValueExpr_**,_std::vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<SQCompilation::ExternalValueExpr_**,_std::vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<SQCompilation::ExternalValueExpr_**,_std::vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>_>
              ::operator*(&local_38);
    (**((*ppEVar2)->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj)();
    __gnu_cxx::
    __normal_iterator<SQCompilation::ExternalValueExpr_**,_std::vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>_>
    ::operator++(&local_38);
  }
  LiteralExpr::~LiteralExpr((LiteralExpr *)0x187650);
  LiteralExpr::~LiteralExpr((LiteralExpr *)0x187661);
  LiteralExpr::~LiteralExpr((LiteralExpr *)0x187672);
  std::
  vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>::
  ~vector((vector<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
           *)this_00._M_current);
  std::
  unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
  ::~unordered_map((unordered_map<const_SQCompilation::Node_*,_SQCompilation::ValueRef_*,_std::hash<const_SQCompilation::Node_*>,_std::equal_to<const_SQCompilation::Node_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>_>
                    *)0x187694);
  std::
  unordered_set<const_char_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<const_char_*>_>
  ::~unordered_set((unordered_set<const_char_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<const_char_*>_>
                    *)0x1876a5);
  std::
  unordered_set<const_char_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<const_char_*>_>
  ::~unordered_set((unordered_set<const_char_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<const_char_*>_>
                    *)0x1876b6);
  std::
  unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
  ::~unordered_map((unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
                    *)0x1876c4);
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::~vector((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             *)this_00._M_current);
  Visitor::~Visitor((Visitor *)in_RDI);
  return;
}

Assistant:

CheckerVisitor::~CheckerVisitor() {
  for (auto &p : functionInfoMap) {
    if (p.second)
      p.second->~FunctionInfo();
  }
  for (auto ev : externalValues)
    ev->~ExternalValueExpr();
}